

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

void printBar(int np,string *pstr)

{
  ostream *this;
  int local_1c;
  int i;
  string *pstr_local;
  int np_local;
  
  std::operator<<((ostream *)&std::cout,"|");
  for (local_1c = 0; local_1c < np; local_1c = local_1c + 1) {
    std::operator<<((ostream *)&std::cout,(string *)pstr);
  }
  this = std::operator<<((ostream *)&std::cout,"|");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"|");
  return;
}

Assistant:

void printBar(int np, const std::string pstr)
{
	std::cout << "|";
	for (int i = 0; i < np; i++)
		std::cout << pstr;
	std::cout << "|" << std::endl;
	std::cout << "|";
}